

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom
          (ExtensionSet *this,MessageLite *extendee,ExtensionSet *other)

{
  bool bVar1;
  undefined1 local_61;
  ExtensionSet *other_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  undefined8 local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  bVar1 = IsCompletelyEmpty(this);
  local_61 = 0;
  if (bVar1) {
    bVar1 = is_large(other);
    local_61 = bVar1 ^ 0xff;
  }
  if ((local_61 & 1) == 0) {
    InternalMergeFromSlow(this,extendee,other);
  }
  else {
    InternalMergeFromSmallToEmpty(this,extendee,other);
  }
  return;
}

Assistant:

void ExtensionSet::MergeFrom(const MessageLite* extendee,
                             const ExtensionSet& other) {
  Prefetch5LinesFrom1Line(&other);
  if (ABSL_PREDICT_TRUE(IsCompletelyEmpty() && !other.is_large())) {
    InternalMergeFromSmallToEmpty(extendee, other);
    return;
  }
  InternalMergeFromSlow(extendee, other);
}